

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBreakCommand.cxx
# Opt level: O1

bool __thiscall
cmBreakCommand::InitialPass
          (cmBreakCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar6;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  bVar3 = cmMakefile::IsLoopBlock((this->super_cmCommand).Makefile);
  if (bVar3) {
LAB_002784af:
    status->BreakInvoked = true;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0055);
      if (PVar4 - NEW < 3) {
        MVar6 = FATAL_ERROR;
        bVar3 = true;
        bVar2 = true;
      }
      else {
        if (PVar4 == OLD) {
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (PVar4 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x37,id_00);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                local_1c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            bVar3 = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        bVar2 = false;
        MVar6 = AUTHOR_WARNING;
      }
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The BREAK command does not accept any arguments.",0x30);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,MVar6,&local_1c8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) goto LAB_002785b1;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
    bVar3 = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0055);
    if (PVar4 - NEW < 3) {
      MVar6 = FATAL_ERROR;
      bVar3 = true;
      bVar2 = true;
    }
    else {
      if (PVar4 == OLD) {
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if (PVar4 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x37,id);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                              local_1c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          bVar3 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      bVar2 = false;
      MVar6 = AUTHOR_WARNING;
    }
    if (!bVar3) {
LAB_00278491:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      goto LAB_002784af;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "A BREAK command was found outside of a proper FOREACH or WHILE loop scope.",0x4a);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,MVar6,&local_1c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) goto LAB_00278491;
LAB_002785b1:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmBreakCommand::InitialPass(std::vector<std::string> const &args,
                                  cmExecutionStatus &status)
{
  if(!this->Makefile->IsLoopBlock())
    {
    bool issueMessage = true;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0055))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = cmake::FATAL_ERROR;
        break;
      }

    if(issueMessage)
      {
      e << "A BREAK command was found outside of a proper "
           "FOREACH or WHILE loop scope.";
      this->Makefile->IssueMessage(messageType, e.str());
       if(messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  status.SetBreakInvoked(true);

  if(!args.empty())
    {
    bool issueMessage = true;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0055))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = cmake::FATAL_ERROR;
        break;
      }

    if(issueMessage)
      {
      e << "The BREAK command does not accept any arguments.";
      this->Makefile->IssueMessage(messageType, e.str());
       if(messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  return true;
}